

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

void Fra_ClassesCopyReprs(Fra_Cla_t *p,Vec_Ptr_t *vFailed)

{
  Vec_Ptr_t *p_00;
  void *pvVar1;
  int i;
  long lVar2;
  
  Aig_ManReprStart(p->pAig,p->pAig->vObjs->nSize);
  memmove(p->pAig->pReprs,p->pMemRepr,(long)p->pAig->vObjs->nSize << 3);
  if ((p->vClasses1->nSize == 0) && (p->vClasses->nSize == 0)) {
    for (lVar2 = 0; p_00 = p->pAig->vObjs, lVar2 < p_00->nSize; lVar2 = lVar2 + 1) {
      pvVar1 = Vec_PtrEntry(p_00,(int)lVar2);
      if ((pvVar1 != (void *)0x0) && (p->pAig->pReprs[lVar2] != (Aig_Obj_t *)0x0)) {
        puts("Classes are not cleared!");
        if (p->pAig->pReprs[lVar2] != (Aig_Obj_t *)0x0) {
          __assert_fail("p->pAig->pReprs[i] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraClass.c"
                        ,0x7e,"void Fra_ClassesCopyReprs(Fra_Cla_t *, Vec_Ptr_t *)");
        }
      }
    }
  }
  if (vFailed != (Vec_Ptr_t *)0x0) {
    for (i = 0; i < vFailed->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(vFailed,i);
      p->pAig->pReprs[*(int *)((long)pvVar1 + 0x24)] = (Aig_Obj_t *)0x0;
    }
  }
  return;
}

Assistant:

void Fra_ClassesCopyReprs( Fra_Cla_t * p, Vec_Ptr_t * vFailed )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManReprStart( p->pAig, Aig_ManObjNumMax(p->pAig) );
    memmove( p->pAig->pReprs, p->pMemRepr, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p->pAig) );
    if ( Vec_PtrSize(p->vClasses1) == 0 && Vec_PtrSize(p->vClasses) == 0 )
    {
        Aig_ManForEachObj( p->pAig, pObj, i )
        {
            if ( p->pAig->pReprs[i] != NULL )
                printf( "Classes are not cleared!\n" );
            assert( p->pAig->pReprs[i] == NULL );
        }
    }
    if ( vFailed )
        Vec_PtrForEachEntry( Aig_Obj_t *, vFailed, pObj, i )
            p->pAig->pReprs[pObj->Id] = NULL;
}